

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O0

void extent_dalloc_gap(tsdn_t *tsdn,arena_t *arena,extent_t *extent)

{
  _Bool _Var1;
  tsdn_t *in_RDX;
  arena_t *in_RDI;
  extent_hooks_t *extent_hooks;
  tsd_t *tsd;
  tsdn_t *in_stack_00000028;
  uint8_t state;
  extent_t *extent_00;
  arena_stats_u64_t *local_38;
  arena_t *in_stack_ffffffffffffffd8;
  undefined1 growing_retained;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  arena_t *in_stack_ffffffffffffffe8;
  arena_t *in_stack_fffffffffffffff0;
  arena_t *in_stack_fffffffffffffff8;
  
  extent_00 = (extent_t *)0x0;
  if (in_RDI == (arena_t *)0x0) {
    local_38 = (arena_stats_u64_t *)0x0;
    in_RDI = in_stack_ffffffffffffffd8;
  }
  else {
    in_stack_ffffffffffffffe7 = *(undefined1 *)&((malloc_mutex_t *)in_RDI->nthreads)->field_0;
    local_38 = &(in_RDI->stats).lstats[0x71].nrequests;
    in_stack_ffffffffffffffe8 = in_RDI;
    in_stack_fffffffffffffff0 = in_RDI;
    in_stack_fffffffffffffff8 = in_RDI;
  }
  growing_retained = (undefined1)((ulong)in_RDI >> 0x38);
  witness_assert_depth_to_rank((witness_tsdn_t *)local_38,0xc,0);
  _Var1 = extent_register(in_RDX,extent_00);
  if (_Var1) {
    extents_leak((tsdn_t *)extent_hooks,in_stack_fffffffffffffff8,
                 (extent_hooks_t **)in_stack_fffffffffffffff0,(extents_t *)in_stack_ffffffffffffffe8
                 ,(extent_t *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
                 (_Bool)growing_retained);
  }
  else {
    extent_dalloc_wrapper
              (in_stack_00000028,(arena_t *)tsd,(extent_hooks_t **)tsdn,(extent_t *)arena);
  }
  return;
}

Assistant:

void
extent_dalloc_gap(tsdn_t *tsdn, arena_t *arena, extent_t *extent) {
	extent_hooks_t *extent_hooks = EXTENT_HOOKS_INITIALIZER;

	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, 0);

	if (extent_register(tsdn, extent)) {
		extents_leak(tsdn, arena, &extent_hooks,
		    &arena->extents_retained, extent, false);
		return;
	}
	extent_dalloc_wrapper(tsdn, arena, &extent_hooks, extent);
}